

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

int CmdCommandPrintCompare(Abc_Command **ppC1,Abc_Command **ppC2)

{
  Abc_Command *pAVar1;
  Abc_Command *pAVar2;
  int iVar3;
  int RetValue;
  Abc_Command *pC2;
  Abc_Command *pC1;
  Abc_Command **ppC2_local;
  Abc_Command **ppC1_local;
  
  pAVar1 = *ppC1;
  pAVar2 = *ppC2;
  iVar3 = strcmp(pAVar1->sGroup,pAVar2->sGroup);
  if (iVar3 < 0) {
    ppC1_local._4_4_ = -1;
  }
  else if (iVar3 < 1) {
    if ((*pAVar1->sName == '_') || (*pAVar2->sName != '_')) {
      if ((*pAVar1->sName == '_') && (*pAVar2->sName != '_')) {
        ppC1_local._4_4_ = 1;
      }
      else {
        iVar3 = strcmp(pAVar1->sName,pAVar2->sName);
        if (iVar3 < 0) {
          ppC1_local._4_4_ = -1;
        }
        else {
          if (iVar3 < 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdUtils.c"
                          ,0x2b3,"int CmdCommandPrintCompare(Abc_Command **, Abc_Command **)");
          }
          ppC1_local._4_4_ = 1;
        }
      }
    }
    else {
      ppC1_local._4_4_ = -1;
    }
  }
  else {
    ppC1_local._4_4_ = 1;
  }
  return ppC1_local._4_4_;
}

Assistant:

int CmdCommandPrintCompare( Abc_Command ** ppC1, Abc_Command ** ppC2 )
{
    Abc_Command * pC1 = *ppC1;
    Abc_Command * pC2 = *ppC2;
    int RetValue;

    RetValue = strcmp( pC1->sGroup, pC2->sGroup );
    if ( RetValue < 0 )
        return -1;
    if ( RetValue > 0 )
        return 1;
    // the command belong to the same group

    // put commands with "_" at the end of the list
    if ( pC1->sName[0] != '_' && pC2->sName[0] == '_' )
        return -1;
    if ( pC1->sName[0] == '_' && pC2->sName[0] != '_' )
        return 1;

    RetValue = strcmp( pC1->sName, pC2->sName );
    if ( RetValue < 0 )
        return -1;
    if ( RetValue > 0 )
        return 1;
     // should not be two indentical commands
    assert( 0 );
    return 0;
}